

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O3

QStringList * QGenericUnixTheme::themeNames(void)

{
  QByteArray *pQVar1;
  char *pcVar2;
  long lVar3;
  QArrayData *pQVar4;
  QByteArray *pQVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  undefined4 extraout_var;
  storage_type *psVar9;
  QList<QString> *in_RDI;
  long lVar10;
  QByteArray *desktopName;
  QByteArray *rhs;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QLatin1String QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArray local_138;
  QByteArray local_120;
  QByteArray local_108;
  QByteArray local_f0;
  QString local_d8;
  QArrayDataPointer<QByteArray> local_b8;
  QArrayDataPointer<QByteArray> local_98;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0x0;
  (in_RDI->d).ptr = (QString *)0x0;
  (in_RDI->d).size = 0;
  bVar6 = QGuiApplication::desktopSettingsAware();
  if (bVar6) {
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    iVar8 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0x13])();
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar8) + 0x20))
              (&local_78,(long *)CONCAT44(extraout_var,iVar8));
    local_98.d = (Data *)0x0;
    local_98.ptr = (QByteArray *)0x0;
    local_98.size = 0;
    QByteArray::QByteArray((QByteArray *)&local_58,"GNOME",-1);
    QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
              ((QMovableArrayOps<QByteArray> *)&local_98,local_98.size,(QByteArray *)&local_58);
    QList<QByteArray>::end((QList<QByteArray> *)&local_98);
    QByteArray::QByteArray((QByteArray *)&local_b8,"X-CINNAMON",-1);
    QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
              ((QMovableArrayOps<QByteArray> *)&local_98,local_98.size,(QByteArray *)&local_b8);
    QList<QByteArray>::end((QList<QByteArray> *)&local_98);
    QByteArray::QByteArray((QByteArray *)&local_d8,"PANTHEON",-1);
    QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
              ((QMovableArrayOps<QByteArray> *)&local_98,local_98.size,(QByteArray *)&local_d8);
    QList<QByteArray>::end((QList<QByteArray> *)&local_98);
    QByteArray::QByteArray(&local_f0,"UNITY",-1);
    QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
              ((QMovableArrayOps<QByteArray> *)&local_98,local_98.size,&local_f0);
    QList<QByteArray>::end((QList<QByteArray> *)&local_98);
    QByteArray::QByteArray(&local_108,"MATE",-1);
    QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
              ((QMovableArrayOps<QByteArray> *)&local_98,local_98.size,&local_108);
    QList<QByteArray>::end((QList<QByteArray> *)&local_98);
    QByteArray::QByteArray(&local_120,"XFCE",-1);
    QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
              ((QMovableArrayOps<QByteArray> *)&local_98,local_98.size,&local_120);
    QList<QByteArray>::end((QList<QByteArray> *)&local_98);
    QByteArray::QByteArray(&local_138,"LXDE",-1);
    QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
              ((QMovableArrayOps<QByteArray> *)&local_98,local_98.size,&local_138);
    QList<QByteArray>::end((QList<QByteArray> *)&local_98);
    if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_120.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_120.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f0.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_b8.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    QByteArray::split((char)&local_b8);
    if ((undefined1 *)local_b8.size != (undefined1 *)0x0) {
      pQVar1 = local_b8.ptr + local_b8.size;
      rhs = local_b8.ptr;
      do {
        local_58.d.d = (Data *)0x6cb4e3;
        bVar6 = ::operator==((QByteArray *)&local_78,(char **)&local_58);
        pQVar5 = local_98.ptr;
        if (bVar6) {
          if (QKdeTheme::name == (char *)0x0) {
            psVar9 = (storage_type *)0x0;
          }
          else {
            psVar9 = (storage_type *)0xffffffffffffffff;
            do {
              pcVar2 = QKdeTheme::name + 1 + (long)psVar9;
              psVar9 = psVar9 + 1;
            } while (*pcVar2 != '\0');
          }
LAB_0062e444:
          QVar13.m_data = psVar9;
          QVar13.m_size = (qsizetype)&local_58;
          QString::fromLatin1(QVar13);
          local_d8.d.d = local_58.d.d;
          local_d8.d.ptr = local_58.d.ptr;
          local_d8.d.size = local_58.d.size;
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)in_RDI,(in_RDI->d).size,&local_d8);
          QList<QString>::end(in_RDI);
          if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            iVar8 = ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
            UNLOCK();
            pQVar4 = &(local_d8.d.d)->super_QArrayData;
joined_r0x0062e375:
            if (iVar8 == 0) {
              QArrayData::deallocate(pQVar4,2,0x10);
            }
          }
        }
        else {
          if (local_98.size != 0) {
            lVar3 = local_98.size * 0x18;
            lVar10 = 0;
            do {
              if (lVar3 == lVar10) goto LAB_0062e243;
              bVar6 = ::operator==((QByteArray *)((long)&(pQVar5->d).d + lVar10),rhs);
              lVar10 = lVar10 + 0x18;
            } while (!bVar6);
            if ((long)local_98.ptr - (long)pQVar5 != lVar10) {
              local_58.d.d = (Data *)0x0;
              local_58.d.ptr = L"gtk3";
              local_58.d.size = 4;
              QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                        ((QMovableArrayOps<QString> *)in_RDI,(in_RDI->d).size,&local_58);
              QList<QString>::end(in_RDI);
              if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (QGnomeTheme::name == (char *)0x0) {
                psVar9 = (storage_type *)0x0;
              }
              else {
                psVar9 = (storage_type *)0xffffffffffffffff;
                do {
                  pcVar2 = QGnomeTheme::name + 1 + (long)psVar9;
                  psVar9 = psVar9 + 1;
                } while (*pcVar2 != '\0');
              }
              goto LAB_0062e444;
            }
          }
LAB_0062e243:
          local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QByteArray::toLower_helper((QByteArray *)&local_d8);
          QVar11.m_data = (storage_type *)local_d8.d.size;
          QVar11.m_size = (qsizetype)&local_58;
          QString::fromLatin1(QVar11);
          if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,1,0x10);
            }
          }
          QVar12.m_data = (char *)0x2;
          QVar12.m_size = (qsizetype)&local_58;
          cVar7 = QString::startsWith(QVar12,0x6c89a8);
          if (cVar7 == '\0') {
            local_d8.d.d = local_58.d.d;
            local_d8.d.ptr = local_58.d.ptr;
            local_d8.d.size = local_58.d.size;
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   1;
              UNLOCK();
            }
          }
          else {
            QString::mid((longlong)&local_d8,(longlong)&local_58);
          }
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)in_RDI,(in_RDI->d).size,&local_d8);
          QList<QString>::end(in_RDI);
          if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            iVar8 = ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
            UNLOCK();
            pQVar4 = &(local_58.d.d)->super_QArrayData;
            goto joined_r0x0062e375;
          }
        }
        rhs = rhs + 1;
      } while (rhs != pQVar1);
    }
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_98);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (name == (char *)0x0) {
    psVar9 = (storage_type *)0x0;
  }
  else {
    psVar9 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar2 = name + 1 + (long)psVar9;
      psVar9 = psVar9 + 1;
    } while (*pcVar2 != '\0');
  }
  QVar14.m_data = psVar9;
  QVar14.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar14);
  local_78.d.d = local_58.d.d;
  local_78.d.ptr = local_58.d.ptr;
  local_78.d.size = local_58.d.size;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)in_RDI,(in_RDI->d).size,&local_78);
  QList<QString>::end(in_RDI);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QGenericUnixTheme::themeNames()
{
    QStringList result;
    if (QGuiApplication::desktopSettingsAware()) {
        const QByteArray desktopEnvironment = QGuiApplicationPrivate::platformIntegration()->services()->desktopEnvironment();
        QList<QByteArray> gtkBasedEnvironments;
        gtkBasedEnvironments << "GNOME"
                             << "X-CINNAMON"
                             << "PANTHEON"
                             << "UNITY"
                             << "MATE"
                             << "XFCE"
                             << "LXDE";
        const QList<QByteArray> desktopNames = desktopEnvironment.split(':');
        for (const QByteArray &desktopName : desktopNames) {
#if QT_CONFIG(dbus) && QT_CONFIG(settings) && (QT_CONFIG(xcb) || QT_CONFIG(wayland))
            if (desktopEnvironment == "KDE") {
                result.push_back(QLatin1StringView(QKdeTheme::name));
            } else
#endif
           if (gtkBasedEnvironments.contains(desktopName)) {
                // prefer the GTK3 theme implementation with native dialogs etc.
                result.push_back(QStringLiteral("gtk3"));
                // fallback to the generic Gnome theme if loading the GTK3 theme fails
                result.push_back(QLatin1StringView(QGnomeTheme::name));
            } else {
                // unknown, but lowercase the name (our standard practice) and
                // remove any "x-" prefix
                QString s = QString::fromLatin1(desktopName.toLower());
                result.push_back(s.startsWith("x-"_L1) ? s.mid(2) : s);
            }
        }
    } // desktopSettingsAware
    result.append(QLatin1StringView(QGenericUnixTheme::name));
    return result;
}